

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddField(DuckTableEntry *this,ClientContext *context,AddFieldInfo *info)

{
  AlterInfo *this_00;
  reference pvVar1;
  ColumnDefinition *this_01;
  LogicalType *pLVar2;
  string *name;
  AlterInfo *in_RCX;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  ChangeColumnTypeInfo change_column_type;
  StructMappingInfo res;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_280;
  ParsedExpression *local_278;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_270;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_268;
  AddFieldInfo *local_248;
  LogicalType local_240;
  LogicalType local_228;
  string local_210;
  ChangeColumnTypeInfo local_1f0;
  StructMappingInfo local_138;
  AlterEntryData local_98;
  
  this_00 = in_RCX + 1;
  local_248 = info;
  pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)this_00,0);
  this_01 = ColumnList::GetColumn((ColumnList *)&(context->config).asof_loop_join_threshold,pvVar1);
  pLVar2 = ColumnDefinition::Type(this_01);
  AddFieldToStruct(&local_138,pLVar2,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)this_00,(ColumnDefinition *)&in_RCX[1].catalog._M_string_length,0);
  if (local_138.error.initialized == true) {
    if (*(char *)&in_RCX[3].super_ParseInfo._vptr_ParseInfo == '\0') {
      ::std::__cxx11::string::string
                ((string *)&local_1f0,anon_var_dwarf_3b6586a + 9,(allocator *)&local_268);
      ErrorData::Throw(&local_138.error,(string *)&local_1f0);
    }
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)0x0;
  }
  else {
    local_268.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)this_00,0);
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&local_280,pvVar1);
    local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)local_280._M_head_impl;
    local_280._M_head_impl = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_268,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_1f0);
    if ((ParsedExpression *)
        local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo !=
        (ParsedExpression *)0x0) {
      (*((BaseExpression *)
        local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo)->
        _vptr_BaseExpression[1])();
    }
    local_1f0.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
         (_func_int **)0x0;
    if (local_280._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    LogicalType::LogicalType(&local_240,&local_138.new_type);
    Value::Value((Value *)&local_1f0,&local_240);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_278,(Value *)&local_1f0);
    local_280._M_head_impl = local_278;
    local_278 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_268,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_280);
    if (local_280._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_280._M_head_impl = (ParsedExpression *)0x0;
    if (local_278 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_278 + 8))();
    }
    local_278 = (ParsedExpression *)0x0;
    Value::~Value((Value *)&local_1f0);
    LogicalType::~LogicalType(&local_240);
    name = ColumnDefinition::Name_abi_cxx11_(this_01);
    pLVar2 = ColumnDefinition::Type(this_01);
    ConstructMapping((Value *)&local_1f0,name,pLVar2);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_278,(Value *)&local_1f0);
    local_280._M_head_impl = local_278;
    local_278 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_268,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_280);
    if (local_280._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_280._M_head_impl = (ParsedExpression *)0x0;
    if (local_278 != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_278 + 8))();
    }
    local_278 = (ParsedExpression *)0x0;
    Value::~Value((Value *)&local_1f0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_268,&local_138.default_value);
    make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_280,(char (*) [13])"remap_struct",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_268);
    AlterInfo::GetAlterEntryData(&local_98,in_RCX);
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)this_00,0);
    ::std::__cxx11::string::string((string *)&local_210,(string *)pvVar1);
    LogicalType::LogicalType(&local_228,&local_138.new_type);
    local_270._M_head_impl = local_280._M_head_impl;
    local_280._M_head_impl = (ParsedExpression *)0x0;
    ChangeColumnTypeInfo::ChangeColumnTypeInfo
              (&local_1f0,&local_98,&local_210,&local_228,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_270);
    if (local_270._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_270._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_270._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType(&local_228);
    ::std::__cxx11::string::~string((string *)&local_210);
    AlterEntryData::~AlterEntryData(&local_98);
    ChangeColumnType(this,context,(ChangeColumnTypeInfo *)local_248);
    ChangeColumnTypeInfo::~ChangeColumnTypeInfo(&local_1f0);
    if (local_280._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_268);
  }
  StructMappingInfo::~StructMappingInfo(&local_138);
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddField(ClientContext &context, AddFieldInfo &info) {
	// follow the path
	auto &col = GetColumn(info.column_path[0]);
	auto res = AddFieldToStruct(col.Type(), info.column_path, info.new_field);
	if (res.error.HasError()) {
		if (!info.if_field_not_exists) {
			res.error.Throw();
		}
		return nullptr;
	}

	// construct the struct remapping expression
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ColumnRefExpression>(info.column_path[0]));
	children.push_back(make_uniq<ConstantExpression>(Value(res.new_type)));
	children.push_back(make_uniq<ConstantExpression>(ConstructMapping(col.Name(), col.Type())));
	children.push_back(std::move(res.default_value));

	auto function = make_uniq<FunctionExpression>("remap_struct", std::move(children));

	ChangeColumnTypeInfo change_column_type(info.GetAlterEntryData(), info.column_path[0], std::move(res.new_type),
	                                        std::move(function));
	return ChangeColumnType(context, change_column_type);
}